

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  key_type kVar11;
  value_type line;
  value_type vVar12;
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  hasher *in_RDI;
  AssertionResult gtest_ar__12;
  int i_1;
  int i;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  TypeParam ht3;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  hasher hasher;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff908;
  int in_stack_fffffffffffff90c;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  undefined4 in_stack_fffffffffffff920;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffff924;
  int in_stack_fffffffffffff92c;
  undefined4 in_stack_fffffffffffff930;
  undefined4 uVar14;
  undefined1 in_stack_fffffffffffff934;
  undefined1 in_stack_fffffffffffff935;
  undefined1 in_stack_fffffffffffff936;
  undefined1 in_stack_fffffffffffff937;
  undefined4 in_stack_fffffffffffff938;
  undefined1 in_stack_fffffffffffff93c;
  undefined1 in_stack_fffffffffffff93d;
  undefined1 in_stack_fffffffffffff93e;
  undefined1 in_stack_fffffffffffff93f;
  undefined4 in_stack_fffffffffffff948;
  uint i_00;
  char *in_stack_fffffffffffff970;
  char *in_stack_fffffffffffff978;
  char *in_stack_fffffffffffff980;
  AssertionResult *in_stack_fffffffffffff988;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff990;
  AssertionResult local_658 [3];
  value_type local_620;
  int local_61c;
  value_type local_5f0;
  int local_5ec;
  string local_5e8 [55];
  undefined1 local_5b1;
  AssertionResult local_5b0 [3];
  value_type local_574;
  string local_570 [55];
  byte local_539;
  AssertionResult local_538;
  string local_528 [55];
  undefined1 local_4f1;
  AssertionResult local_4f0 [3];
  value_type local_4b4;
  string local_4b0 [55];
  byte local_479;
  AssertionResult local_478;
  string local_468 [55];
  undefined1 local_431;
  AssertionResult local_430 [9];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_398 [2];
  string local_378 [55];
  undefined1 local_341;
  AssertionResult local_340;
  string local_330 [55];
  byte local_2f9;
  AssertionResult local_2f8;
  string local_2e8 [55];
  undefined1 local_2b1;
  AssertionResult local_2b0;
  key_type local_29c;
  string local_298 [55];
  byte local_261;
  AssertionResult local_260;
  string local_250 [55];
  undefined1 local_219;
  AssertionResult local_218;
  string local_208 [55];
  byte local_1d1;
  AssertionResult local_1d0;
  string local_1c0 [55];
  undefined1 local_189;
  AssertionResult local_188;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_178 [12];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b8 [11];
  
  i_00 = 0;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             in_stack_fffffffffffff90c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             in_stack_fffffffffffff90c);
  this_00 = (HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(ulong)i_00;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_b8,i_00,(int *)this_00);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (this_00,CONCAT44(i_00,in_stack_fffffffffffff948),in_RDI,
             (key_equal *)
             CONCAT17(in_stack_fffffffffffff93f,
                      CONCAT16(in_stack_fffffffffffff93e,
                               CONCAT15(in_stack_fffffffffffff93d,
                                        CONCAT14(in_stack_fffffffffffff93c,in_stack_fffffffffffff938
                                                )))),
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffff937,
                      CONCAT16(in_stack_fffffffffffff936,
                               CONCAT15(in_stack_fffffffffffff935,
                                        CONCAT14(in_stack_fffffffffffff934,in_stack_fffffffffffff930
                                                )))));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_b8);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             in_stack_fffffffffffff90c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             in_stack_fffffffffffff90c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_178,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (this_00,CONCAT44(i_00,in_stack_fffffffffffff948),in_RDI,
             (key_equal *)
             CONCAT17(in_stack_fffffffffffff93f,
                      CONCAT16(in_stack_fffffffffffff93e,
                               CONCAT15(in_stack_fffffffffffff93d,
                                        CONCAT14(in_stack_fffffffffffff93c,in_stack_fffffffffffff938
                                                )))),
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffff937,
                      CONCAT16(in_stack_fffffffffffff936,
                               CONCAT15(in_stack_fffffffffffff935,
                                        CONCAT14(in_stack_fffffffffffff934,in_stack_fffffffffffff930
                                                )))));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_178);
  uVar1 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                       (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  local_189 = uVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             (bool *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),(type *)0xeea6c0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_188);
  if (!bVar2) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_RDI,
               CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffff93e,
                                       CONCAT11(in_stack_fffffffffffff93d,in_stack_fffffffffffff93c)
                                      )),
               (char *)CONCAT17(in_stack_fffffffffffff937,
                                CONCAT16(in_stack_fffffffffffff936,
                                         CONCAT15(in_stack_fffffffffffff935,
                                                  CONCAT14(in_stack_fffffffffffff934,
                                                           in_stack_fffffffffffff930)))),
               in_stack_fffffffffffff92c,
               (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
    std::__cxx11::string::~string(local_1c0);
    testing::Message::~Message((Message *)0xeea804);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeea898);
  uVar3 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                       (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  local_1d1 = ~uVar3 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             (bool *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),(type *)0xeea8d6)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
  if (!bVar2) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_RDI,
               CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(in_stack_fffffffffffff93d,
                                                      in_stack_fffffffffffff93c))),
               (char *)CONCAT17(in_stack_fffffffffffff937,
                                CONCAT16(in_stack_fffffffffffff936,
                                         CONCAT15(in_stack_fffffffffffff935,
                                                  CONCAT14(in_stack_fffffffffffff934,
                                                           in_stack_fffffffffffff930)))),
               in_stack_fffffffffffff92c,
               (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
    std::__cxx11::string::~string(local_208);
    testing::Message::~Message((Message *)0xeea9ab);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeeaa3f);
  uVar4 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                       (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  local_219 = uVar4;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             (bool *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),(type *)0xeeaa80)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_218);
  if (!bVar2) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_RDI,
               CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,in_stack_fffffffffffff93c))),
               (char *)CONCAT17(in_stack_fffffffffffff937,
                                CONCAT16(in_stack_fffffffffffff936,
                                         CONCAT15(in_stack_fffffffffffff935,
                                                  CONCAT14(in_stack_fffffffffffff934,
                                                           in_stack_fffffffffffff930)))),
               in_stack_fffffffffffff92c,
               (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
    std::__cxx11::string::~string(local_250);
    testing::Message::~Message((Message *)0xeeab55);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeeabe9);
  uVar5 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                       (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  local_261 = ~uVar5 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             (bool *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),(type *)0xeeac2c)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_260);
  if (!bVar2) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),
               (char *)CONCAT17(in_stack_fffffffffffff937,
                                CONCAT16(in_stack_fffffffffffff936,
                                         CONCAT15(in_stack_fffffffffffff935,
                                                  CONCAT14(in_stack_fffffffffffff934,
                                                           in_stack_fffffffffffff930)))),
               in_stack_fffffffffffff92c,
               (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
    std::__cxx11::string::~string(local_298);
    testing::Message::~Message((Message *)0xeead01);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeead98);
  kVar11 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                       in_stack_fffffffffffff90c);
  local_29c = kVar11;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                    (key_type *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  uVar6 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                       (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  local_2b1 = uVar6;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             (bool *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),(type *)0xeeae10)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
  if (!bVar2) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),
               (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffff936,
                                               CONCAT15(in_stack_fffffffffffff935,
                                                        CONCAT14(in_stack_fffffffffffff934,
                                                                 in_stack_fffffffffffff930)))),
               in_stack_fffffffffffff92c,
               (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
    std::__cxx11::string::~string(local_2e8);
    testing::Message::~Message((Message *)0xeeaee5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeeaf79);
  uVar7 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                       (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  local_2f9 = ~uVar7 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             (bool *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),(type *)0xeeafbc)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2f8);
  if (!bVar2) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),
               (char *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(in_stack_fffffffffffff935,
                                                              CONCAT14(in_stack_fffffffffffff934,
                                                                       in_stack_fffffffffffff930))))
               ,in_stack_fffffffffffff92c,
               (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
    std::__cxx11::string::~string(local_330);
    testing::Message::~Message((Message *)0xeeb091);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeeb125);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
           CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  uVar8 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                       (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  local_341 = uVar8;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             (bool *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),(type *)0xeeb17a)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_340);
  if (!bVar2) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),
               (char *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(
                                                  in_stack_fffffffffffff934,
                                                  in_stack_fffffffffffff930)))),
               in_stack_fffffffffffff92c,
               (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
    std::__cxx11::string::~string(local_378);
    testing::Message::~Message((Message *)0xeeb24f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeeb2e6);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             in_stack_fffffffffffff90c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_398,2,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (this_00,CONCAT44(i_00,in_stack_fffffffffffff948),in_RDI,
             (key_equal *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar11)))),
             (allocator_type *)
             CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(in_stack_fffffffffffff934,
                                                                   in_stack_fffffffffffff930)))));
  uVar9 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                       (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  local_431 = uVar9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             (bool *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),(type *)0xeeb37a)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_430);
  if (!bVar2) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),
               (char *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,
                                                  in_stack_fffffffffffff930)))),
               in_stack_fffffffffffff92c,
               (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
    std::__cxx11::string::~string(local_468);
    testing::Message::~Message((Message *)0xeeb481);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeeb515);
  bVar2 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                       (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  uVar14 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff930);
  local_479 = ~bVar2 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             (bool *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),(type *)0xeeb558)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_478);
  if (!bVar2) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),
               (char *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,uVar14)))),
               in_stack_fffffffffffff92c,
               (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
    std::__cxx11::string::~string(local_4b0);
    testing::Message::~Message((Message *)0xeeb62d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeeb6c4);
  line = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                        in_stack_fffffffffffff90c);
  local_4b4 = line;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff990,(value_type *)in_stack_fffffffffffff988);
  local_4f1 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator!=((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                           (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             (bool *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),(type *)0xeeb744)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_4f0);
  if (!bVar2) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),
               (char *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,uVar14)))),line,
               (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
    std::__cxx11::string::~string(local_528);
    testing::Message::~Message((Message *)0xeeb819);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeeb8ad);
  bVar2 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                       (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  local_539 = ~bVar2 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             (bool *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),(type *)0xeeb8f0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_538);
  if (!bVar2) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),
               (char *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,uVar14)))),line,
               (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
    std::__cxx11::string::~string(local_570);
    testing::Message::~Message((Message *)0xeeb9c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeeba5c);
  vVar12 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                          in_stack_fffffffffffff90c);
  local_574 = vVar12;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff990,(value_type *)in_stack_fffffffffffff988);
  local_5b1 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                           (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  uVar13 = CONCAT13(local_5b1,(int3)in_stack_fffffffffffff920);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             (bool *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),(type *)0xeebadc)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_5b0);
  if (!bVar2) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),
               (char *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,uVar14)))),line,
               (char *)CONCAT44(vVar12,uVar13));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910));
    std::__cxx11::string::~string(local_5e8);
    testing::Message::~Message((Message *)0xeebbb1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeebc45);
  for (local_5ec = 3; local_5ec < 0x7d1; local_5ec = local_5ec + 1) {
    local_5f0 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                               in_stack_fffffffffffff90c);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff990,(value_type *)in_stack_fffffffffffff988);
  }
  for (local_61c = 2000; 2 < local_61c; local_61c = local_61c + -1) {
    local_620 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                               in_stack_fffffffffffff90c);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff990,(value_type *)in_stack_fffffffffffff988);
  }
  uVar10 = google::
           BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                        (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(uVar10,in_stack_fffffffffffff910),
             (bool *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),(type *)0xeebd71)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_658);
  if (!bVar2) {
    testing::Message::Message((Message *)in_RDI);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               in_stack_fffffffffffff970);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),
               (char *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,uVar14)))),line,
               (char *)CONCAT44(vVar12,uVar13));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff990,(Message *)in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar10,in_stack_fffffffffffff910));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff970);
    testing::Message::~Message((Message *)0xeebe2b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeebeb9);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xeebec6);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_398);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xeebee0);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xeebeed);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}